

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O0

bool __thiscall
unodb::
olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::insert(olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
         *this,span<const_std::byte,_18446744073709551615UL> insert_key,value_type v)

{
  art_key_type k_00;
  bool bVar1;
  undefined1 local_40 [8];
  art_key_type k;
  olc_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
  *this_local;
  value_type v_local;
  span<const_std::byte,_18446744073709551615UL> insert_key_local;
  
  k.field_0.key._M_extent._M_extent_value = (__extent_storage<18446744073709551615UL>)this;
  detail::basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_>::basic_art_key
            ((basic_art_key<std::span<const_std::byte,_18446744073709551615UL>_> *)local_40,
             insert_key);
  k_00.field_0.key._M_extent._M_extent_value =
       (__extent_storage<18446744073709551615UL>)
       (__extent_storage<18446744073709551615UL>)k.field_0.key._M_ptr;
  k_00.field_0.key._M_ptr = (pointer)local_40;
  bVar1 = insert_internal(this,k_00,v);
  return bVar1;
}

Assistant:

[[nodiscard]] bool insert(Key insert_key, value_type v) {
    // TODO(thompsonbry) There should be a lambda variant of this to
    // handle conflicts and support upsert or delete-upsert
    // semantics. This would call the caller's lambda once the method
    // was positioned on the leaf.  The caller could then update the
    // value or perhaps delete the entry under the key.
    const auto k = art_key_type{insert_key};
    return insert_internal(k, v);
  }